

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  xmlNodePtr *ppxVar4;
  char *extra;
  long lVar5;
  
  if (0 < set2->nodeNr) {
    iVar3 = set1->nodeMax;
    lVar5 = 0;
    do {
      pxVar2 = set2->nodeTab[lVar5];
      if (iVar3 == 0) {
        ppxVar4 = (xmlNodePtr *)(*xmlMalloc)(0x50);
        set1->nodeTab = ppxVar4;
        if (ppxVar4 == (xmlNodePtr *)0x0) {
LAB_001e937a:
          extra = "merging nodeset\n";
LAB_001e938a:
          xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
          return (xmlNodeSetPtr)0x0;
        }
        ppxVar4[8] = (xmlNodePtr)0x0;
        ppxVar4[9] = (xmlNodePtr)0x0;
        ppxVar4[6] = (xmlNodePtr)0x0;
        ppxVar4[7] = (xmlNodePtr)0x0;
        ppxVar4[4] = (xmlNodePtr)0x0;
        ppxVar4[5] = (xmlNodePtr)0x0;
        ppxVar4[2] = (xmlNodePtr)0x0;
        ppxVar4[3] = (xmlNodePtr)0x0;
        *ppxVar4 = (xmlNodePtr)0x0;
        ppxVar4[1] = (xmlNodePtr)0x0;
        iVar3 = 10;
LAB_001e934f:
        set1->nodeMax = iVar3;
      }
      else if (iVar3 <= set1->nodeNr) {
        if (9999999 < iVar3) {
          extra = "merging nodeset hit limit\n";
          goto LAB_001e938a;
        }
        ppxVar4 = (xmlNodePtr *)(*xmlRealloc)(set1->nodeTab,(long)(iVar3 * 2) << 3);
        if (ppxVar4 == (xmlNodePtr *)0x0) goto LAB_001e937a;
        set1->nodeTab = ppxVar4;
        iVar3 = set1->nodeMax * 2;
        goto LAB_001e934f;
      }
      iVar1 = set1->nodeNr;
      set1->nodeNr = iVar1 + 1;
      set1->nodeTab[iVar1] = pxVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < set2->nodeNr);
  }
  set2->nodeNr = 0;
  return set1;
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    if (set1->nodeMax == 0) {
		set1->nodeTab = (xmlNodePtr *) xmlMalloc(
		    XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
		if (set1->nodeTab == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		memset(set1->nodeTab, 0,
		    XML_NODESET_DEFAULT * (size_t) sizeof(xmlNodePtr));
		set1->nodeMax = XML_NODESET_DEFAULT;
	    } else if (set1->nodeNr >= set1->nodeMax) {
		xmlNodePtr *temp;

                if (set1->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
                    xmlXPathErrMemory(NULL, "merging nodeset hit limit\n");
                    return(NULL);
                }
		temp = (xmlNodePtr *) xmlRealloc(
		    set1->nodeTab, set1->nodeMax * 2 * sizeof(xmlNodePtr));
		if (temp == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		set1->nodeTab = temp;
		set1->nodeMax *= 2;
	    }
	    set1->nodeTab[set1->nodeNr++] = n2;
	}
    }
    set2->nodeNr = 0;
    return(set1);
}